

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::BaseLineTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BaseLineTestInstance *this)

{
  deUint32 width;
  bool bVar1;
  int iVar2;
  float extraout_XMM0_Da;
  ScopedLogSection section;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  IVec4 colorBits;
  string iterationDescription;
  string local_258;
  ScopedLogSection local_230;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  RasterizationArguments local_1dc;
  tcu local_1c8 [8];
  int local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [8];
  pointer pSStack_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [23];
  
  local_1dc.numSamples = this->m_iteration + 1;
  de::toString<int>(&local_228,&local_1dc.numSamples);
  std::operator+(&local_200,"Test iteration ",&local_228);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 &local_200," / ");
  de::toString<int>(&local_258,&this->m_iterationCount);
  std::operator+(&local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 &local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_228);
  tcu::ScopedLogSection::ScopedLogSection
            (&local_230,
             ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
             m_log,&local_1b8,&local_1b8);
  (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[3])(this);
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface((Surface *)&local_200,width,width);
  local_228.field_2._M_allocated_capacity = 0;
  local_228._M_dataplus._M_p = (pointer)0x0;
  local_228._M_string_length = 0;
  local_258.field_2._M_allocated_capacity = 0;
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  if (extraout_XMM0_Da <= this->m_maxLineWidth) {
    (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[7])
              (this,(ulong)(uint)this->m_iteration,&local_228,&local_258);
    BaseRenderingTestInstance::drawPrimitives
              (&this->super_BaseRenderingTestInstance,(Surface *)&local_200,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_228,
               this->m_primitiveTopology);
    local_198 = (undefined1  [8])0x0;
    pSStack_190 = (pointer)0x0;
    local_188[0]._M_allocated_capacity = 0;
    tcu::getTextureFormatBitDepth
              (local_1c8,&(this->super_BaseRenderingTestInstance).m_textureFormat);
    local_1dc.numSamples = (int)((this->super_BaseRenderingTestInstance).m_multisampling != 0);
    local_1dc.subpixelBits = (this->super_BaseRenderingTestInstance).m_subpixelBits;
    local_1dc._8_8_ = local_1c8;
    local_1dc.blueBits = local_1c0;
    local_198 = (undefined1  [8])local_258._M_dataplus._M_p;
    pSStack_190 = (pointer)local_258._M_string_length;
    local_188[0]._M_allocated_capacity = local_258.field_2._M_allocated_capacity;
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_258.field_2._M_allocated_capacity = 0;
    bVar1 = tcu::verifyClippedTriangulatedLineGroupRasterization
                      ((Surface *)&local_200,(LineSceneSpec *)local_198,&local_1dc,
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                       m_testCtx->m_log);
    if (!bVar1) {
      this->m_allIterationsPassed = false;
    }
    std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
    ::~_Vector_base((_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     *)local_198);
  }
  else {
    local_198 = (undefined1  [8])
                ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
                m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_190);
    std::operator<<((ostream *)&pSStack_190,"Line width ");
    std::ostream::operator<<((ostringstream *)&pSStack_190,extraout_XMM0_Da);
    std::operator<<((ostream *)&pSStack_190," not supported, skipping iteration.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_190);
  }
  iVar2 = this->m_iteration + 1;
  this->m_iteration = iVar2;
  if (iVar2 == this->m_iterationCount) {
    if (this->m_allIterationsPassed == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_198,"Pass",(allocator<char> *)&local_1dc);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_198);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_198,"Incorrect rasterization",(allocator<char> *)&local_1dc);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_198);
    }
    std::__cxx11::string::~string((string *)local_198);
  }
  else {
    tcu::TestStatus::incomplete();
  }
  std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~_Vector_base((_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)&local_258);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &local_228);
  tcu::Surface::~Surface((Surface *)&local_200);
  tcu::ScopedLogSection::~ScopedLogSection(&local_230);
  std::__cxx11::string::~string((string *)&local_1b8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BaseLineTestInstance::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_context.getTestContext().getLog(), iterationDescription, iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// gen data
		generateLines(m_iteration, drawBuffer, lines);

		// draw image
		drawPrimitives(resultImage, drawBuffer, m_primitiveTopology);

		// compare
		{
			RasterizationArguments	args;
			LineSceneSpec			scene;


			tcu::IVec4				colorBits = tcu::getTextureFormatBitDepth(getTextureFormat());

			args.numSamples		= m_multisampling ? 1 : 0;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= colorBits[0];
			args.greenBits		= colorBits[1];
			args.blueBits		= colorBits[2];

			scene.lines.swap(lines);
			scene.lineWidth = lineWidth;

			if (!verifyClippedTriangulatedLineGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog()))
				m_allIterationsPassed = false;
		}
	}
	else
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rasterization");
	}
	else
		return tcu::TestStatus::incomplete();
}